

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

lua_Number lua_tonumber(lua_State *L,int idx)

{
  TValue *local_38;
  TValue *o;
  TValue n;
  int idx_local;
  lua_State *L_local;
  
  n._12_4_ = idx;
  local_38 = index2adr(L,idx);
  if ((local_38->tt != 3) &&
     (local_38 = luaV_tonumber(local_38,(TValue *)&o), local_38 == (TValue *)0x0)) {
    return 0.0;
  }
  return (lua_Number)(local_38->value).gc;
}

Assistant:

static lua_Number lua_tonumber(lua_State*L,int idx){
TValue n;
const TValue*o=index2adr(L,idx);
if(tonumber(o,&n))
return nvalue(o);
else
return 0;
}